

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TargetCodeGenerator.h
# Opt level: O3

void __thiscall
flow::TargetCodeGenerator::emitInstr(TargetCodeGenerator *this,Opcode opc,Operand op1)

{
  iterator __position;
  undefined6 in_register_00000032;
  unsigned_long local_8;
  
  local_8 = (unsigned_long)(int)((uint)op1 << 0x10 | (uint)CONCAT62(in_register_00000032,opc));
  __position._M_current =
       (this->code_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->code_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_long,std::allocator<unsigned_long>>::
    _M_realloc_insert<unsigned_long_const&>
              ((vector<unsigned_long,std::allocator<unsigned_long>> *)&this->code_,__position,
               &local_8);
  }
  else {
    *__position._M_current = local_8;
    (this->code_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = __position._M_current + 1;
  }
  return;
}

Assistant:

void emitInstr(Opcode opc, Operand op1) {
    emitInstr(makeInstruction(opc, op1));
  }